

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transition.cc
# Opt level: O1

size_t tchecker::ta::shared_hash_value(transition_t *t)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  
  sVar1 = syncprod::shared_hash_value(&t->super_transition_t);
  sVar2 = boost::
          hash_value<tchecker::clock_constraint_t,std::allocator<tchecker::clock_constraint_t>>
                    (&t->_src_invariant);
  sVar3 = boost::
          hash_value<tchecker::clock_constraint_t,std::allocator<tchecker::clock_constraint_t>>
                    (&t->_guard);
  sVar4 = boost::hash_value<tchecker::clock_reset_t,std::allocator<tchecker::clock_reset_t>>
                    (&t->_reset);
  sVar5 = boost::
          hash_value<tchecker::clock_constraint_t,std::allocator<tchecker::clock_constraint_t>>
                    (&t->_tgt_invariant);
  return ((sVar5 * -0x395b586ca42e166b ^ sVar5 * -0x395b586ca42e166b >> 0x2f) * -0x395b586ca42e166b
         ^ ((sVar4 * -0x395b586ca42e166b ^ sVar4 * -0x395b586ca42e166b >> 0x2f) *
            -0x395b586ca42e166b ^
           ((sVar3 * -0x395b586ca42e166b ^ sVar3 * -0x395b586ca42e166b >> 0x2f) *
            -0x395b586ca42e166b ^
           ((sVar2 * -0x395b586ca42e166b ^ sVar2 * -0x395b586ca42e166b >> 0x2f) *
            -0x395b586ca42e166b ^ sVar1) * -0x395b586ca42e166b + 0xe6546b64) * -0x395b586ca42e166b +
           0xe6546b64) * -0x395b586ca42e166b + 0xe6546b64) * -0x395b586ca42e166b + 0xe6546b64;
}

Assistant:

std::size_t shared_hash_value(tchecker::ta::transition_t const & t)
{
  std::size_t h = tchecker::syncprod::shared_hash_value(t);
  boost::hash_combine(h, t.src_invariant_container());
  boost::hash_combine(h, t.guard_container());
  boost::hash_combine(h, t.reset_container());
  boost::hash_combine(h, t.tgt_invariant_container());
  return h;
}